

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

t_operand __thiscall
xemmai::ast::t_literal<long>::f_emit
          (t_literal<long> *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  t_instruction tVar1;
  t_emit *ptVar2;
  t_operand tVar3;
  bool a_clear_local;
  bool a_operand_local;
  bool a_tail_local;
  t_emit *a_emit_local;
  t_literal<long> *this_local;
  anon_union_8_4_0f1077ea_for_t_operand_2 local_10;
  
  if (a_operand) {
    t_operand::t_operand((t_operand *)&this_local,this->v_value);
  }
  else if (a_clear) {
    t_operand::t_operand((t_operand *)&this_local);
  }
  else {
    if (a_tail) {
      t_emit::f_emit_safe_point(a_emit,&this->super_t_node);
      tVar1 = t_emit::f_instruction_of<long>();
      ptVar2 = t_emit::operator<<(a_emit,tVar1 + c_instruction__FINALLY);
      t_emit::operator<<(ptVar2,this->v_value);
    }
    else {
      tVar1 = t_emit::f_instruction_of<long>();
      ptVar2 = t_emit::operator<<(a_emit,tVar1);
      ptVar2 = t_emit::operator<<(ptVar2,a_emit->v_stack);
      t_emit::operator<<(ptVar2,this->v_value);
    }
    t_emit::f_push(a_emit);
    t_emit::f_at(a_emit,&this->super_t_node);
    t_operand::t_operand((t_operand *)&this_local);
  }
  tVar3._4_4_ = 0;
  tVar3.v_tag = (uint)this_local;
  tVar3.field_1.v_integer = local_10.v_integer;
  return tVar3;
}

Assistant:

t_operand t_literal<T>::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	if (a_operand) return v_value;
	if (a_clear) return {};
	if (a_tail) {
		a_emit.f_emit_safe_point(this);
		a_emit << static_cast<t_instruction>(t_emit::f_instruction_of<T>() + c_instruction__RETURN_NUL - c_instruction__NUL) << v_value;
	} else {
		a_emit << t_emit::f_instruction_of<T>() << a_emit.v_stack << v_value;
	}
	a_emit.f_push();
	a_emit.f_at(this);
	return {};
}